

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_option_ds(arg_dstr_t ds,char *shortopts,char *longopts,char *datatype,char *suffix)

{
  char *local_100;
  char local_f8 [8];
  char syntax [200];
  char *suffix_local;
  char *datatype_local;
  char *longopts_local;
  char *shortopts_local;
  arg_dstr_t ds_local;
  
  syntax._192_8_ = suffix;
  memset(local_f8,0,200);
  if (syntax._192_8_ == 0) {
    local_100 = "";
  }
  else {
    local_100 = (char *)syntax._192_8_;
  }
  syntax._192_8_ = local_100;
  arg_cat_optionv(local_f8,199,shortopts,longopts,datatype,0,"|");
  arg_dstr_cat(ds,local_f8);
  arg_dstr_cat(ds,(char *)syntax._192_8_);
  return;
}

Assistant:

void arg_print_option_ds(arg_dstr_t ds, const char* shortopts, const char* longopts, const char* datatype, const char* suffix) {
    char syntax[200] = "";
    suffix = suffix ? suffix : "";

    /* there is no way of passing the proper optvalue for optional argument values here, so we must ignore it */
    arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, 0, "|");

    arg_dstr_cat(ds, syntax);
    arg_dstr_cat(ds, (char*)suffix);
}